

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::source_funcname_formatter<spdlog::details::null_scoped_padder>::format
          (source_funcname_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,
          tm *param_2,memory_buf_t *dest)

{
  bool bVar1;
  memory_buf_t *dest_00;
  string_view_t view;
  size_t local_58;
  basic_string_view<char> local_48;
  null_scoped_padder local_31;
  size_t sStack_30;
  null_scoped_padder p;
  size_t text_size;
  memory_buf_t *dest_local;
  tm *param_2_local;
  log_msg *msg_local;
  source_funcname_formatter<spdlog::details::null_scoped_padder> *this_local;
  
  bVar1 = source_loc::empty(&msg->source);
  if (!bVar1) {
    bVar1 = padding_info::enabled(&(this->super_flag_formatter).padinfo_);
    if (bVar1) {
      local_58 = CLI::std::char_traits<char>::length((msg->source).funcname);
    }
    else {
      local_58 = 0;
    }
    sStack_30 = local_58;
    dest_00 = dest;
    null_scoped_padder::null_scoped_padder
              (&local_31,local_58,&(this->super_flag_formatter).padinfo_,dest);
    ::fmt::v7::basic_string_view<char>::basic_string_view(&local_48,(msg->source).funcname);
    view.size_ = (size_t)dest;
    view.data_ = (char *)local_48.size_;
    fmt_helper::append_string_view((fmt_helper *)local_48.data_,view,dest_00);
  }
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        if (msg.source.empty())
        {
            return;
        }
        size_t text_size = padinfo_.enabled() ? std::char_traits<char>::length(msg.source.funcname) : 0;
        ScopedPadder p(text_size, padinfo_, dest);
        fmt_helper::append_string_view(msg.source.funcname, dest);
    }